

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VCMP_dp(DisasContext_conflict1 *s,arg_VCMP_dp *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i64 var;
  TCGv_i64 var_00;
  TCGv_i64 vm;
  TCGv_i64 vd;
  TCGContext_conflict1 *tcg_ctx;
  arg_VCMP_dp *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_fpdp_v2(s->isar);
  if (_Var1) {
    if ((a->z == 0) || (a->vm == 0)) {
      _Var1 = isar_feature_aa32_simd_r32(s->isar);
      if ((_Var1) || (((a->vd | a->vm) & 0x10U) == 0)) {
        _Var1 = vfp_access_check(s);
        if (_Var1) {
          var = tcg_temp_new_i64(tcg_ctx_00);
          var_00 = tcg_temp_new_i64(tcg_ctx_00);
          neon_load_reg64(tcg_ctx_00,var,a->vd);
          if (a->z == 0) {
            neon_load_reg64(tcg_ctx_00,var_00,a->vm);
          }
          else {
            tcg_gen_movi_i64_aarch64(tcg_ctx_00,var_00,0);
          }
          if (a->e == 0) {
            gen_helper_vfp_cmpd(tcg_ctx_00,var,var_00,tcg_ctx_00->cpu_env);
          }
          else {
            gen_helper_vfp_cmped(tcg_ctx_00,var,var_00,tcg_ctx_00->cpu_env);
          }
          tcg_temp_free_i64(tcg_ctx_00,var);
          tcg_temp_free_i64(tcg_ctx_00,var_00);
          s_local._7_1_ = true;
        }
        else {
          s_local._7_1_ = true;
        }
      }
      else {
        s_local._7_1_ = false;
      }
    }
    else {
      s_local._7_1_ = false;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VCMP_dp(DisasContext *s, arg_VCMP_dp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 vd, vm;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* Vm/M bits must be zero for the Z variant */
    if (a->z && a->vm != 0) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && ((a->vd | a->vm) & 0x10)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    vd = tcg_temp_new_i64(tcg_ctx);
    vm = tcg_temp_new_i64(tcg_ctx);

    neon_load_reg64(tcg_ctx, vd, a->vd);
    if (a->z) {
        tcg_gen_movi_i64(tcg_ctx, vm, 0);
    } else {
        neon_load_reg64(tcg_ctx, vm, a->vm);
    }

    if (a->e) {
        gen_helper_vfp_cmped(tcg_ctx, vd, vm, tcg_ctx->cpu_env);
    } else {
        gen_helper_vfp_cmpd(tcg_ctx, vd, vm, tcg_ctx->cpu_env);
    }

    tcg_temp_free_i64(tcg_ctx, vd);
    tcg_temp_free_i64(tcg_ctx, vm);

    return true;
}